

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

ctmbstr tidyOptGetNextDeclTag(TidyDoc tdoc,TidyOptionId optId,TidyIterator *iter)

{
  ctmbstr ptVar1;
  UserTagType UStack_8;
  
  if (tdoc == (TidyDoc)0x0) {
    return (ctmbstr)0x0;
  }
  if (optId == TidyPreTags) {
    UStack_8 = tagtype_pre;
  }
  else if (optId == TidyEmptyTags) {
    UStack_8 = tagtype_empty;
  }
  else if (optId == TidyInlineTags) {
    UStack_8 = tagtype_inline;
  }
  else {
    if (optId != TidyBlockTags) {
      return (ctmbstr)0x0;
    }
    UStack_8 = tagtype_block;
  }
  ptVar1 = prvTidyGetNextDeclaredTag((TidyDocImpl *)tdoc,UStack_8,iter);
  return ptVar1;
}

Assistant:

ctmbstr TIDY_CALL       tidyOptGetNextDeclTag( TidyDoc tdoc, TidyOptionId optId,
                                     TidyIterator* iter )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    ctmbstr tagnam = NULL;
    if ( impl )
    {
        UserTagType tagtyp = tagtype_null;
        if ( optId == TidyInlineTags )
            tagtyp = tagtype_inline;
        else if ( optId == TidyBlockTags )
            tagtyp = tagtype_block;
        else if ( optId == TidyEmptyTags )
            tagtyp = tagtype_empty;
        else if ( optId == TidyPreTags )
            tagtyp = tagtype_pre;
        if ( tagtyp != tagtype_null )
            tagnam = TY_(GetNextDeclaredTag)( impl, tagtyp, iter );
    }
    return tagnam;
}